

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandLeak2Area(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  int fVerbose;
  int c;
  float B;
  float A;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  c = 0x3f800000;
  fVerbose = 0x3f800000;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"ABvh");
      if (iVar2 == -1) {
        if (pAbc->pLibScl == (void *)0x0) {
          fprintf((FILE *)pAbc->Err,"There is no Liberty library available.\n");
          return 1;
        }
        Abc_SclConvertLeakageIntoArea((SC_Lib *)pAbc->pLibScl,(float)c,(float)fVerbose);
        return 0;
      }
      if (iVar2 == 0x41) break;
      if (iVar2 == 0x42) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-B\" should be followed by a floating point number.\n"
                   );
          goto LAB_004b6c36;
        }
        dVar4 = atof(argv[globalUtilOptind]);
        fVerbose = (int)(float)dVar4;
        globalUtilOptind = globalUtilOptind + 1;
        if ((float)fVerbose <= 0.0) goto LAB_004b6c36;
      }
      else {
        if ((iVar2 == 0x68) || (iVar2 != 0x76)) goto LAB_004b6c36;
        bVar1 = (bool)(bVar1 ^ 1);
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-A\" should be followed by a floating point number.\n");
      break;
    }
    dVar4 = atof(argv[globalUtilOptind]);
    c = (int)(float)dVar4;
    globalUtilOptind = globalUtilOptind + 1;
  } while (0.0 < (float)c);
LAB_004b6c36:
  fprintf((FILE *)pAbc->Err,"usage: leak2area [-AB float] [-v]\n");
  fprintf((FILE *)pAbc->Err,
          "\t           converts leakage into area: Area = A * Area + B * Leakage\n");
  fprintf((FILE *)pAbc->Err,
          "\t-A float : the multiplicative coefficient to transform area [default = %.2f]\n",
          (double)(float)c);
  fprintf((FILE *)pAbc->Err,
          "\t-B float : the multiplicative coefficient to transform leakage [default = %.2f]\n",
          (double)(float)fVerbose);
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar3);
  fprintf((FILE *)pAbc->Err,"\t-h       : print the help massage\n");
  return 1;
}

Assistant:

int Scl_CommandLeak2Area( Abc_Frame_t * pAbc, int argc, char **argv )
{
    float A = 1, B = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ABvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a floating point number.\n" );
                goto usage;
            }
            A = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( A <= 0.0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a floating point number.\n" );
                goto usage;
            }
            B = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( B <= 0.0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }
    // update the current library
    Abc_SclConvertLeakageIntoArea( (SC_Lib *)pAbc->pLibScl, A, B );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: leak2area [-AB float] [-v]\n" );
    fprintf( pAbc->Err, "\t           converts leakage into area: Area = A * Area + B * Leakage\n" );
    fprintf( pAbc->Err, "\t-A float : the multiplicative coefficient to transform area [default = %.2f]\n", A );
    fprintf( pAbc->Err, "\t-B float : the multiplicative coefficient to transform leakage [default = %.2f]\n", B );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    return 1;
}